

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

CpuSet * ncnn::get_cpu_thread_affinity_mask(int powersave)

{
  uint in_EDI;
  CpuSet *local_8;
  
  setup_thread_affinity_masks();
  if (in_EDI == 0) {
    local_8 = (CpuSet *)g_thread_affinity_mask_all;
  }
  else if (in_EDI == 1) {
    local_8 = (CpuSet *)g_thread_affinity_mask_little;
  }
  else if (in_EDI == 2) {
    local_8 = (CpuSet *)g_thread_affinity_mask_big;
  }
  else {
    fprintf(_stderr,"powersave %d not supported",(ulong)in_EDI);
    fprintf(_stderr,"\n");
    local_8 = (CpuSet *)g_thread_affinity_mask_all;
  }
  return local_8;
}

Assistant:

const CpuSet& get_cpu_thread_affinity_mask(int powersave)
{
    setup_thread_affinity_masks();

    if (powersave == 0)
        return g_thread_affinity_mask_all;

    if (powersave == 1)
        return g_thread_affinity_mask_little;

    if (powersave == 2)
        return g_thread_affinity_mask_big;

    NCNN_LOGE("powersave %d not supported", powersave);

    // fallback to all cores anyway
    return g_thread_affinity_mask_all;
}